

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O2

REF_STATUS ref_grid_inward_boundary_orientation(REF_GRID ref_grid)

{
  int iVar1;
  int iVar2;
  REF_CELL ref_cell;
  REF_CELL pRVar3;
  REF_DBL *pRVar4;
  REF_INT *pRVar5;
  REF_INT *pRVar6;
  bool bVar7;
  bool bVar8;
  REF_STATUS RVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  REF_CELL *ppRVar14;
  undefined8 uVar15;
  int iVar16;
  char *pcVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  REF_INT cell1;
  REF_INT cell0;
  REF_CELL local_f8;
  long local_f0;
  REF_INT face_nodes [4];
  undefined8 local_a8;
  int iStack_a0;
  int iStack_9c;
  
  local_f8 = ref_grid->cell[3];
  ref_cell = ref_grid->cell[6];
  iVar16 = 0;
  do {
    if (local_f8->max <= iVar16) {
      iVar16 = 0;
      do {
        if (ref_cell->max <= iVar16) {
          return 0;
        }
        RVar9 = ref_cell_nodes(ref_cell,iVar16,(REF_INT *)&local_a8);
        if (RVar9 == 0) {
          for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
            face_nodes[lVar12] = *(REF_INT *)((long)&local_a8 + lVar12 * 4);
          }
          bVar7 = false;
          ppRVar14 = ref_grid->cell + 8;
          for (lVar12 = 8; lVar12 != 0x10; lVar12 = lVar12 + 1) {
            pRVar3 = *ppRVar14;
            uVar10 = ref_cell_with_face(pRVar3,face_nodes,&cell0,&cell1);
            if (uVar10 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                     ,0x2de,"ref_grid_inward_boundary_orientation",(ulong)uVar10,"wf");
              return uVar10;
            }
            if ((long)cell0 != -1) {
              lVar13 = (long)cell1;
              if (lVar13 != -1) {
                pcVar17 = "boundary quad with two cells";
                uVar15 = 0x2e0;
                goto LAB_00148020;
              }
              local_f0 = CONCAT44(local_f0._4_4_,iStack_a0);
              local_f8 = (REF_CELL)CONCAT44(local_f8._4_4_,iStack_9c);
              uVar20 = (ulong)(uint)pRVar3->face_per;
              if (pRVar3->face_per < 1) {
                uVar20 = 0;
              }
              for (lVar13 = 0; uVar20 * 0x10 != lVar13; lVar13 = lVar13 + 0x10) {
                pRVar5 = pRVar3->f2n;
                pRVar6 = pRVar3->c2n;
                lVar18 = (long)pRVar3->size_per * (long)cell0;
                lVar19 = (long)(int)lVar18;
                iVar11 = pRVar6[lVar18 + *(int *)((long)pRVar5 + lVar13)];
                iVar1 = pRVar6[*(int *)((long)pRVar5 + lVar13 + 0xc) + lVar19];
                bVar8 = bVar7;
                if ((iVar11 != iVar1) &&
                   (((((((int)local_a8 == iVar1 &&
                        (local_a8._4_4_ == pRVar6[*(int *)((long)pRVar5 + lVar13 + 8) + lVar19])) &&
                       (iStack_a0 == pRVar6[*(int *)((long)pRVar5 + lVar13 + 4) + lVar19])) &&
                      (iStack_9c == iVar11)) ||
                     ((((iVar2 = pRVar6[*(int *)((long)pRVar5 + lVar13 + 8) + lVar19],
                        (int)local_a8 == iVar2 &&
                        (local_a8._4_4_ == pRVar6[*(int *)((long)pRVar5 + lVar13 + 4) + lVar19])) &&
                       ((iStack_a0 == iVar11 && (iStack_9c == iVar1)))) ||
                      (((((int)local_a8 == pRVar6[*(int *)((long)pRVar5 + lVar13 + 4) + lVar19] &&
                         (local_a8._4_4_ == iVar11)) &&
                        ((iStack_a0 == iVar1 && (iStack_9c == iVar2)))) ||
                       (((((int)local_a8 == iVar11 && (local_a8._4_4_ == iVar1)) &&
                         (iStack_a0 == iVar2)) &&
                        (iStack_9c == pRVar6[*(int *)((long)pRVar5 + lVar13 + 4) + lVar19]))))))))
                    && (bVar8 = true, bVar7)))) {
                  uVar15 = 0x2f5;
                  goto LAB_00147d58;
                }
                bVar7 = bVar8;
              }
            }
            ppRVar14 = ref_grid->cell + lVar12 + 1;
          }
          if (bVar7) {
            local_a8 = CONCAT44(face_nodes[2],face_nodes[1]);
            iStack_a0 = face_nodes[1];
            iStack_9c = face_nodes[0];
            uVar10 = ref_cell_replace_whole(ref_cell,iVar16,(REF_INT *)&local_a8);
            if (uVar10 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                     ,0x2ff,"ref_grid_inward_boundary_orientation",(ulong)uVar10,"replace with flip"
                    );
              return uVar10;
            }
          }
        }
        iVar16 = iVar16 + 1;
      } while( true );
    }
    RVar9 = ref_cell_nodes(local_f8,iVar16,(REF_INT *)&local_a8);
    if (RVar9 == 0) {
      for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
        face_nodes[lVar12] = *(REF_INT *)((long)&local_a8 + lVar12 * 4);
      }
      face_nodes[3] = face_nodes[0];
      bVar7 = false;
      lVar12 = 8;
      ppRVar14 = ref_grid->cell + 8;
      while (lVar12 != 0x10) {
        pRVar3 = *ppRVar14;
        local_f0 = lVar12;
        uVar10 = ref_cell_with_face(pRVar3,face_nodes,&cell0,&cell1);
        if (uVar10 != 0) {
          pcVar17 = "with face";
          uVar15 = 0x2a0;
          goto LAB_00147d9c;
        }
        if (cell0 != -1) {
          if (cell1 != -1) {
            printf("group %d cell0 %d cell1 %d\n",local_f0);
            for (uVar20 = 0; iVar11 = pRVar3->node_per, (int)uVar20 < iVar11; uVar20 = uVar20 + 1) {
              pRVar4 = ref_grid->node->real;
              lVar12 = (long)pRVar3->c2n[(long)cell0 * (long)pRVar3->size_per + uVar20];
              printf("cell0 node %d xyz %f %f %f\n",pRVar4[lVar12 * 0xf],pRVar4[lVar12 * 0xf + 1],
                     pRVar4[lVar12 * 0xf + 2],uVar20 & 0xffffffff);
            }
            for (uVar20 = 0; (int)uVar20 < iVar11; uVar20 = uVar20 + 1) {
              pRVar4 = ref_grid->node->real;
              lVar12 = (long)pRVar3->c2n[(long)cell1 * (long)pRVar3->size_per + uVar20];
              printf("cell1 node %d xyz %f %f %f\n",pRVar4[lVar12 * 0xf],pRVar4[lVar12 * 0xf + 1],
                     pRVar4[lVar12 * 0xf + 2],uVar20 & 0xffffffff);
              iVar11 = pRVar3->node_per;
            }
            for (uVar20 = 0; uVar20 != 3; uVar20 = uVar20 + 1) {
              pRVar4 = ref_grid->node->real;
              lVar12 = (long)face_nodes[uVar20];
              printf("face node %d xyz %f %f %f\n",pRVar4[lVar12 * 0xf],pRVar4[lVar12 * 0xf + 1],
                     pRVar4[lVar12 * 0xf + 2],uVar20 & 0xffffffff);
            }
            lVar13 = (long)cell1;
            if (lVar13 != -1) {
              pcVar17 = "boundary triangle with two cells";
              uVar15 = 0x2be;
LAB_00148020:
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                     ,uVar15,"ref_grid_inward_boundary_orientation",pcVar17,0xffffffffffffffff,
                     lVar13);
              return 1;
            }
          }
          uVar20 = (ulong)(uint)pRVar3->face_per;
          if (pRVar3->face_per < 1) {
            uVar20 = 0;
          }
          for (lVar12 = 0; uVar20 * 0x10 != lVar12; lVar12 = lVar12 + 0x10) {
            pRVar5 = pRVar3->f2n;
            pRVar6 = pRVar3->c2n;
            lVar19 = (long)pRVar3->size_per * (long)cell0;
            lVar13 = (long)(int)lVar19;
            iVar11 = pRVar6[lVar19 + *(int *)((long)pRVar5 + lVar12)];
            bVar8 = bVar7;
            if (((iVar11 == pRVar6[*(int *)((long)pRVar5 + lVar12 + 0xc) + lVar13]) &&
                (((((iVar1 = pRVar6[*(int *)((long)pRVar5 + lVar12 + 4) + lVar13],
                    (int)local_a8 == iVar1 && (local_a8._4_4_ == iVar11)) &&
                   (iStack_a0 == pRVar6[*(int *)((long)pRVar5 + lVar12 + 8) + lVar13])) ||
                  (((local_a8._4_4_ == iVar1 && (iStack_a0 == iVar11)) &&
                   ((int)local_a8 == pRVar6[*(int *)((long)pRVar5 + lVar12 + 8) + lVar13])))) ||
                 ((((int)local_a8 == iVar11 && (iStack_a0 == iVar1)) &&
                  (local_a8._4_4_ == pRVar6[*(int *)((long)pRVar5 + lVar12 + 8) + lVar13])))))) &&
               (bVar8 = true, bVar7)) {
              uVar15 = 0x2cd;
LAB_00147d58:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                     ,uVar15,"ref_grid_inward_boundary_orientation","error, flip set twice");
              return 1;
            }
            bVar7 = bVar8;
          }
        }
        ppRVar14 = ref_grid->cell + local_f0 + 1;
        lVar12 = local_f0 + 1;
      }
      if (bVar7) {
        local_a8 = CONCAT44(face_nodes[1],face_nodes[2]);
        iStack_a0 = face_nodes[0];
        uVar10 = ref_cell_replace_whole(local_f8,iVar16,(REF_INT *)&local_a8);
        if (uVar10 != 0) {
          pcVar17 = "replace with flip";
          uVar15 = 0x2d6;
LAB_00147d9c:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 uVar15,"ref_grid_inward_boundary_orientation",(ulong)uVar10,pcVar17);
          return uVar10;
        }
      }
    }
    iVar16 = iVar16 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_grid_inward_boundary_orientation(REF_GRID ref_grid) {
  REF_CELL tri = ref_grid_tri(ref_grid);
  REF_CELL qua = ref_grid_qua(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell, cell0, cell1;
  REF_INT node;
  REF_INT face_nodes[4];
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL flip;
  REF_INT face, group;

  each_ref_cell_valid_cell_with_nodes(tri, cell, nodes) {
    for (node = 0; node < 3; node++) face_nodes[node] = nodes[node];
    face_nodes[3] = face_nodes[0];
    flip = REF_FALSE;
    each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
      RSS(ref_cell_with_face(ref_cell, face_nodes, &cell0, &cell1),
          "with face");
      if (REF_EMPTY == cell0) continue; /* this cell does not have the face */
      if (REF_EMPTY != cell1) {
        printf("group %d cell0 %d cell1 %d\n", group, cell0, cell1);
        for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
          printf("cell0 node %d xyz %f %f %f\n", node,
                 ref_node_xyz(ref_grid_node(ref_grid), 0,
                              ref_cell_c2n(ref_cell, node, cell0)),
                 ref_node_xyz(ref_grid_node(ref_grid), 1,
                              ref_cell_c2n(ref_cell, node, cell0)),
                 ref_node_xyz(ref_grid_node(ref_grid), 2,
                              ref_cell_c2n(ref_cell, node, cell0)));
        }
        for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
          printf("cell1 node %d xyz %f %f %f\n", node,
                 ref_node_xyz(ref_grid_node(ref_grid), 0,
                              ref_cell_c2n(ref_cell, node, cell1)),
                 ref_node_xyz(ref_grid_node(ref_grid), 1,
                              ref_cell_c2n(ref_cell, node, cell1)),
                 ref_node_xyz(ref_grid_node(ref_grid), 2,
                              ref_cell_c2n(ref_cell, node, cell1)));
        }
        for (node = 0; node < 3; node++) {
          printf("face node %d xyz %f %f %f\n", node,
                 ref_node_xyz(ref_grid_node(ref_grid), 0, face_nodes[node]),
                 ref_node_xyz(ref_grid_node(ref_grid), 1, face_nodes[node]),
                 ref_node_xyz(ref_grid_node(ref_grid), 2, face_nodes[node]));
        }
        /* RSS( ref_export_by_extension( ref_grid,
           "bc-flip-debug.tec" ), "ex tec"); */
        REIS(REF_EMPTY, cell1, "boundary triangle with two cells");
      }
      each_ref_cell_cell_face(ref_cell, face) {
        if (ref_cell_f2n(ref_cell, 0, face, cell0) !=
            ref_cell_f2n(ref_cell, 3, face, cell0))
          continue; /* skip quad faces */
        if ((nodes[0] == ref_cell_f2n(ref_cell, 1, face, cell0) &&
             nodes[1] == ref_cell_f2n(ref_cell, 0, face, cell0) &&
             nodes[2] == ref_cell_f2n(ref_cell, 2, face, cell0)) ||
            (nodes[1] == ref_cell_f2n(ref_cell, 1, face, cell0) &&
             nodes[2] == ref_cell_f2n(ref_cell, 0, face, cell0) &&
             nodes[0] == ref_cell_f2n(ref_cell, 2, face, cell0)) ||
            (nodes[2] == ref_cell_f2n(ref_cell, 1, face, cell0) &&
             nodes[0] == ref_cell_f2n(ref_cell, 0, face, cell0) &&
             nodes[1] == ref_cell_f2n(ref_cell, 2, face, cell0))) {
          RAS(!flip, "error, flip set twice");
          flip = REF_TRUE;
        }
      }
    }
    if (flip) {
      nodes[0] = face_nodes[2];
      nodes[1] = face_nodes[1];
      nodes[2] = face_nodes[0];
      RSS(ref_cell_replace_whole(tri, cell, nodes), "replace with flip");
    }
  }

  each_ref_cell_valid_cell_with_nodes(qua, cell, nodes) {
    for (node = 0; node < 4; node++) face_nodes[node] = nodes[node];
    flip = REF_FALSE;
    each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
      RSS(ref_cell_with_face(ref_cell, face_nodes, &cell0, &cell1), "wf");
      if (REF_EMPTY == cell0) continue; /* this cell does not have the face */
      REIS(REF_EMPTY, cell1, "boundary quad with two cells");
      each_ref_cell_cell_face(ref_cell, face) {
        if (ref_cell_f2n(ref_cell, 0, face, cell0) ==
            ref_cell_f2n(ref_cell, 3, face, cell0))
          continue; /* skip tri faces */
        if ((nodes[0] == ref_cell_f2n(ref_cell, 3, face, cell0) &&
             nodes[1] == ref_cell_f2n(ref_cell, 2, face, cell0) &&
             nodes[2] == ref_cell_f2n(ref_cell, 1, face, cell0) &&
             nodes[3] == ref_cell_f2n(ref_cell, 0, face, cell0)) ||
            (nodes[0] == ref_cell_f2n(ref_cell, 2, face, cell0) &&
             nodes[1] == ref_cell_f2n(ref_cell, 1, face, cell0) &&
             nodes[2] == ref_cell_f2n(ref_cell, 0, face, cell0) &&
             nodes[3] == ref_cell_f2n(ref_cell, 3, face, cell0)) ||
            (nodes[0] == ref_cell_f2n(ref_cell, 1, face, cell0) &&
             nodes[1] == ref_cell_f2n(ref_cell, 0, face, cell0) &&
             nodes[2] == ref_cell_f2n(ref_cell, 3, face, cell0) &&
             nodes[3] == ref_cell_f2n(ref_cell, 2, face, cell0)) ||
            (nodes[0] == ref_cell_f2n(ref_cell, 0, face, cell0) &&
             nodes[1] == ref_cell_f2n(ref_cell, 3, face, cell0) &&
             nodes[2] == ref_cell_f2n(ref_cell, 2, face, cell0) &&
             nodes[3] == ref_cell_f2n(ref_cell, 1, face, cell0))) {
          RAS(!flip, "error, flip set twice");
          flip = REF_TRUE;
        }
      }
    }
    if (flip) {
      nodes[0] = face_nodes[3];
      nodes[1] = face_nodes[2];
      nodes[2] = face_nodes[1];
      nodes[3] = face_nodes[0];
      RSS(ref_cell_replace_whole(qua, cell, nodes), "replace with flip");
    }
  }

  return REF_SUCCESS;
}